

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O1

timestamp_ns_t duckdb::Timestamp::TimestampNsFromEpochMicros(int64_t micros)

{
  bool bVar1;
  ConversionException *this;
  timestamp_ns_t result;
  timestamp_t local_48;
  string local_40;
  
  bVar1 = TryMultiplyOperator::Operation<long,long,long>(micros,1000000,&local_48.value);
  if (bVar1) {
    return (timestamp_ns_t)(timestamp_t)local_48.value;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Could not convert Timestamp(MS) to Timestamp(NS)","");
  ConversionException::ConversionException(this,&local_40);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

timestamp_ns_t Timestamp::TimestampNsFromEpochMicros(int64_t micros) {
	D_ASSERT(Timestamp::IsFinite(timestamp_t(micros)));
	timestamp_ns_t result;
	if (!TryMultiplyOperator::Operation(micros, Interval::NANOS_PER_MSEC, result.value)) {
		throw ConversionException("Could not convert Timestamp(MS) to Timestamp(NS)");
	}
	return result;
}